

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osd_w.c
# Opt level: O0

int osd_w(mod2sparse *A,char *synd,char *osd0_decoding,char *osdw_decoding,double *log_prob_ratios,
         int osd_order,int A_rank,char **encoding_operator_inputs,int encoding_input_count)

{
  int len;
  int len_00;
  mod2sparse *m;
  void *__ptr;
  void *__ptr_00;
  double *log_prob_ratios_00;
  char *val;
  char *out_vec;
  mod2sparse *A_00;
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  int *in_RDI;
  mod2sparse *in_R8;
  int in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int bit_no_1;
  int col_no_1;
  unsigned_long j;
  int solution_weight;
  int bit_no;
  int osd_min_weight;
  int osd_0_weight;
  int col_no;
  char *Htx;
  char *g;
  char *y;
  char *x;
  int *rows;
  int *cols;
  int *Ht_cols;
  mod2sparse *Ht;
  mod2sparse *U;
  mod2sparse *L;
  int k;
  int N;
  int M;
  undefined8 in_stack_ffffffffffffff30;
  int iVar1;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  undefined4 uVar2;
  int in_stack_ffffffffffffff44;
  int *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int *in_stack_ffffffffffffff58;
  mod2sparse *U_00;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int iVar3;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar4;
  char *in_stack_ffffffffffffff90;
  char *u;
  
  len = *in_RDI;
  len_00 = in_RDI[1];
  mod2sparse_allocate(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
  mod2sparse_allocate(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
  m = mod2sparse_allocate(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
  __ptr = chk_alloc((uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),(uint)in_stack_ffffffffffffff30
                   );
  __ptr_00 = chk_alloc((uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       (uint)in_stack_ffffffffffffff30);
  log_prob_ratios_00 =
       (double *)
       chk_alloc((uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),(uint)in_stack_ffffffffffffff30);
  val = (char *)chk_alloc((uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                          (uint)in_stack_ffffffffffffff30);
  out_vec = (char *)chk_alloc((uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                              (uint)in_stack_ffffffffffffff30);
  A_00 = (mod2sparse *)
         chk_alloc((uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),(uint)in_stack_ffffffffffffff30)
  ;
  uVar2 = 1;
  iVar1 = in_stack_00000008;
  osd_0_solve(A_00,(mod2sparse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              (mod2sparse *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
              (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              in_stack_ffffffffffffff58,
              (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff90,log_prob_ratios_00,(int)__ptr_00,(int)__ptr);
  for (iVar4 = 0; iVar4 < len_00 - in_stack_00000008; iVar4 = iVar4 + 1) {
    *(undefined4 *)((long)__ptr + (long)iVar4 * 4) =
         *(undefined4 *)((long)__ptr_00 + (long)(iVar4 + in_stack_00000008) * 4);
  }
  mod2sparse_copycols((mod2sparse *)CONCAT44(in_stack_ffffffffffffff44,uVar2),
                      (mod2sparse *)CONCAT44(in_stack_ffffffffffffff3c,iVar1),&in_R8->n_rows);
  iVar4 = bin_char_weight(in_RDX,len_00);
  for (iVar3 = 0; iVar3 < len_00; iVar3 = iVar3 + 1) {
    *(char *)(in_RCX + iVar3) = in_RDX[iVar3];
  }
  for (U_00 = (mod2sparse *)0x0; U_00 < (mod2sparse *)(long)in_stack_00000018;
      U_00 = (mod2sparse *)((long)&U_00->n_rows + 1)) {
    u = *(char **)(in_stack_00000010 + (long)U_00 * 8);
    mod2sparse_mulvec(m,u,(char *)A_00);
    bin_char_add(in_RSI,(char *)A_00,out_vec,len);
    LU_forward_backward_solve
              ((mod2sparse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),U_00,
               (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar2),
               (char *)CONCAT44(in_stack_ffffffffffffff3c,iVar1));
    for (in_stack_ffffffffffffff54 = 0; in_stack_ffffffffffffff54 < len_00 - in_stack_00000008;
        in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1) {
      val[*(int *)((long)__ptr + (long)in_stack_ffffffffffffff54 * 4)] =
           u[in_stack_ffffffffffffff54];
    }
    in_stack_ffffffffffffff64 = bin_char_weight(val,len_00);
    if (in_stack_ffffffffffffff64 < iVar4) {
      for (in_stack_ffffffffffffff50 = 0; iVar4 = in_stack_ffffffffffffff64,
          in_stack_ffffffffffffff50 < len_00;
          in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1) {
        *(char *)(in_RCX + in_stack_ffffffffffffff50) = val[in_stack_ffffffffffffff50];
      }
    }
  }
  free(A_00);
  free(__ptr);
  free(val);
  free(out_vec);
  mod2sparse_free(in_R8);
  free(log_prob_ratios_00);
  free(__ptr_00);
  mod2sparse_free(in_R8);
  mod2sparse_free(in_R8);
  return 0;
}

Assistant:

int osd_w(
        mod2sparse *A, //parity check matrix
        char *synd, //syndrome
        char *osd0_decoding, //char string for OSD0 decoding
        char *osdw_decoding, //char string for higher order decoding
        double *log_prob_ratios, //the soft-decisions (from BP)
        int osd_order, //OSD order
        int A_rank, //rank of parity check matrix
        char **encoding_operator_inputs, //the list of higher order terms to search over
        int encoding_input_count //the number of higher order terms to search over
        ){

    int M = mod2sparse_rows(A);
    int N = mod2sparse_cols(A);

    int k= N - A_rank;
    mod2sparse *L=mod2sparse_allocate(M, A_rank);
    mod2sparse *U=mod2sparse_allocate(A_rank, N);
    mod2sparse *Ht=mod2sparse_allocate(M,k);
    int *Ht_cols=chk_alloc(k,sizeof(*Ht_cols));
    int *cols=chk_alloc(N,sizeof(*cols));
    int *rows=chk_alloc(M,sizeof(*rows));

    char *x;
    char *y=chk_alloc(N,sizeof(*y));
    char *g=chk_alloc(M,sizeof(*g));
    char *Htx=chk_alloc(M,sizeof(*Htx));

    //first we find the OSD-0 solutions
    osd_0_solve(
            A,
            L,
            U,
            cols,
            rows,
            synd,
            osd0_decoding,
            log_prob_ratios,
            A_rank,
            1);

    //create the H_T matrix
    for(int col_no=0;col_no<k;col_no++){
        Ht_cols[col_no]=cols[col_no + A_rank];
    }
    mod2sparse_copycols(A,Ht,Ht_cols);


    /*Calculate the weight of the OSD_0 solution. Higher order solutions are compared against this*/
    int osd_0_weight=bin_char_weight(osd0_decoding,N);

    /*Set OSD_0 as the benchmark to beat*/
    int osd_min_weight=osd_0_weight;
    for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=osd0_decoding[bit_no]; //osdw_decoding is set to osd0_decoding initially

    /*Search through the encoding strings*/
    int solution_weight;
    for(long unsigned int j=0; j<encoding_input_count;j++){

        x=encoding_operator_inputs[j];
        mod2sparse_mulvec(Ht,x,Htx);
        bin_char_add(synd,Htx,g,M);
        LU_forward_backward_solve(L, U, rows, cols, g, y);

        for(int col_no=0;col_no<k;col_no++){
                y[Ht_cols[col_no]]=x[col_no];
            }

        solution_weight=bin_char_weight(y,N);

        if(solution_weight<osd_min_weight){
            osd_min_weight=solution_weight;
            for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=y[bit_no];
        }

    }


    free(Htx);
    free(Ht_cols);
    free(y);
    free(g);
    mod2sparse_free(Ht);
    free(rows);
    free(cols);
    mod2sparse_free(L);
    mod2sparse_free(U);

    return 0;

}